

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  uint bit;
  mapped_type mVar1;
  size_t sVar2;
  Decoration *pDVar3;
  uint3 uVar4;
  SPIRVariable *pSVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  BuiltIn BVar9;
  StorageClass SVar10;
  uint32_t uVar11;
  ExecutionModel EVar12;
  SPIRType *pSVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  undefined4 extraout_var;
  undefined8 uVar16;
  undefined4 extraout_var_01;
  undefined7 uVar20;
  iterator iVar17;
  SPIREntryPoint *pSVar18;
  CompilerError *pCVar19;
  uint32_t *puVar21;
  uint32_t **ppuVar22;
  char *ts_1;
  char (*ts_1_00) [3];
  CompilerGLSL *this_00;
  Decoration *pDVar23;
  ID *__k;
  char (*in_R9) [2];
  SPIRVariable *pSVar24;
  uint uVar25;
  long lVar26;
  allocator local_2c9;
  string local_2c8;
  uint32_t geom_stream;
  SPIRVariable *local_2a0;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  LoopLock local_290;
  ulong local_288;
  SPIRType *local_280;
  ulong local_278;
  CompilerGLSL *local_270;
  ExecutionModel local_264;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  ulong local_258;
  undefined8 local_250;
  StorageClass local_244;
  SPIRVariable *local_240;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_238;
  ulong local_230;
  uint32_t *local_228;
  uint32_t *local_220;
  ParsedIR *local_218;
  TypedID<(spirv_cross::Types)0> *local_210;
  TypedID<(spirv_cross::Types)0> *local_208;
  Bitset emitted_builtins;
  Bitset builtins;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset global_builtins;
  undefined4 extraout_var_00;
  
  emitted_builtins.lower = 0;
  emitted_builtins.higher._M_h._M_buckets = &emitted_builtins.higher._M_h._M_single_bucket;
  emitted_builtins.higher._M_h._M_bucket_count = 1;
  emitted_builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  emitted_builtins.higher._M_h._M_element_count = 0;
  emitted_builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  emitted_builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  emitted_builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  global_builtins.lower = 0;
  global_builtins.higher._M_h._M_buckets = &global_builtins.higher._M_h._M_single_bucket;
  global_builtins.higher._M_h._M_bucket_count = 1;
  global_builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  global_builtins.higher._M_h._M_element_count = 0;
  local_220 = &cull_distance_size;
  cull_distance_size = 0;
  local_228 = &clip_distance_size;
  clip_distance_size = 0;
  global_builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  xfb_stride = 0;
  global_builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  global_builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  xfb_buffer = 0;
  geom_stream = 0;
  builtin_xfb_offsets._M_h._M_buckets = &builtin_xfb_offsets._M_h._M_single_bucket;
  builtin_xfb_offsets._M_h._M_bucket_count = 1;
  builtin_xfb_offsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builtin_xfb_offsets._M_h._M_element_count = 0;
  builtin_xfb_offsets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  builtin_xfb_offsets._M_h._M_rehash_policy._M_next_resize = 0;
  builtin_xfb_offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_218 = &(this->super_Compiler).ir;
  local_264 = model;
  ParsedIR::create_loop_hard_lock(local_218);
  ts_1 = (char *)(this->super_Compiler).ir.ids_for_type[2].
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_210 = (TypedID<(spirv_cross::Types)0> *)
              ((long)ts_1 +
              (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size * 4);
  local_238 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->super_Compiler).ir.meta;
  local_250 = 0;
  local_288 = 0;
  local_278 = 0;
  local_258 = 0;
  local_230 = 0;
  pSVar24 = (SPIRVariable *)0x0;
  local_270 = this;
  local_244 = storage;
  do {
    if ((TypedID<(spirv_cross::Types)0> *)ts_1 == local_210) {
      ParsedIR::LoopLock::~LoopLock(&local_290);
      builtins.lower = (uint64_t)((uint)global_builtins.lower & 0x1b);
      builtins.higher._M_h._M_buckets = &builtins.higher._M_h._M_single_bucket;
      builtins.higher._M_h._M_bucket_count = 1;
      builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      builtins.higher._M_h._M_element_count = 0;
      builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
      builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
      Bitset::operator=(&global_builtins,&builtins);
      this_00 = local_270;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&builtins.higher._M_h);
      if ((local_258 & 1) == 0) {
        Bitset::operator=(&emitted_builtins,&global_builtins);
      }
      if (emitted_builtins.higher._M_h._M_element_count != 0 || emitted_builtins.lower != 0) {
        if (storage == StorageClassOutput) {
          builtins.higher._M_h._M_buckets = (__buckets_ptr)0x0;
          builtins.lower = (uint64_t)&builtins.higher._M_h._M_before_begin;
          builtins.higher._M_h._M_bucket_count = 8;
          if (((byte)local_278 & (byte)local_250 & 1) != 0) {
            if ((this_00->options).es != false) {
              pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,
                         "Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar19,&local_2c8);
              __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            uVar25 = (this_00->options).version;
            if (uVar25 - 0x8c < 300) {
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,"GL_ARB_enhanced_layouts",(allocator *)&local_290);
              require_extension_internal(this_00,&local_2c8);
              ::std::__cxx11::string::~string((string *)&local_2c8);
              if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x1b8)) {
                ::std::__cxx11::string::string
                          ((string *)&local_2c8,"GL_ARB_enhanced_layouts",(allocator *)&local_290);
                require_extension_internal(this_00,&local_2c8);
                ::std::__cxx11::string::~string((string *)&local_2c8);
              }
            }
            else if (uVar25 < 0x8c) {
              pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,
                         "Component decoration is not supported in targets below GLSL 1.40.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar19,&local_2c8);
              __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            ts_1 = ", xfb_stride = ";
            join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                      (&local_2c8,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&xfb_buffer,
                       (uint *)", xfb_stride = ",(char (*) [16])&xfb_stride,(uint *)in_R9);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&builtins,&local_2c8);
            ::std::__cxx11::string::~string((string *)&local_2c8);
            this_00 = local_270;
          }
          if ((local_288 & 1) != 0) {
            EVar12 = Compiler::get_execution_model(&this_00->super_Compiler);
            if (EVar12 != ExecutionModelGeometry) {
              pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,
                         "Geometry streams can only be used in geometry shaders.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar19,&local_2c8);
              __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((this_00->options).es == true) {
              pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,"Multiple geometry streams not supported in ESSL.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar19,&local_2c8);
              __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((this_00->options).version < 400) {
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,"GL_ARB_transform_feedback3",(allocator *)&local_290);
              require_extension_internal(this_00,&local_2c8);
              ::std::__cxx11::string::~string((string *)&local_2c8);
            }
            join<char_const(&)[10],unsigned_int&>
                      (&local_2c8,(spirv_cross *)"stream = ",(char (*) [10])&geom_stream,
                       (uint *)ts_1);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&builtins,&local_2c8);
            ::std::__cxx11::string::~string((string *)&local_2c8);
            this_00 = local_270;
          }
          if (local_264 == ExecutionModelMeshEXT) {
            statement<char_const(&)[24]>(this_00,(char (*) [24])"out gl_MeshPerVertexEXT");
          }
          else if (builtins.higher._M_h._M_buckets == (__buckets_ptr)0x0) {
            statement<char_const(&)[17]>(this_00,(char (*) [17])0x37a267);
          }
          else {
            merge(&local_2c8,
                  (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&builtins,", ");
            statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                      (this_00,(char (*) [8])"layout(",&local_2c8,
                       (char (*) [19])") out gl_PerVertex");
            ::std::__cxx11::string::~string((string *)&local_2c8);
          }
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                          *)&builtins);
        }
        else {
          pSVar18 = Compiler::get_entry_point(&this_00->super_Compiler);
          if (pSVar18->geometry_passthrough == true) {
            statement<char_const(&)[36]>
                      (this_00,(char (*) [36])"layout(passthrough) in gl_PerVertex");
          }
          else {
            statement<char_const(&)[16]>(this_00,(char (*) [16])0x37a28c);
          }
        }
        begin_scope(this_00);
        if ((emitted_builtins.lower & 1) != 0) {
          builtins.lower = builtins.lower & 0xffffffff00000000;
          iVar17 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[18]>(this_00,(char (*) [18])0x37a2b3);
          }
          else {
            statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                      (this_00,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar17.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [20])") vec4 gl_Position;");
          }
        }
        if ((emitted_builtins.lower & 2) != 0) {
          builtins.lower = CONCAT44(builtins.lower._4_4_,1);
          iVar17 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[20]>(this_00,(char (*) [20])0x37a2c7);
          }
          else {
            statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                      (this_00,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar17.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [22])") float gl_PointSize;");
          }
        }
        if ((emitted_builtins.lower & 8) != 0) {
          builtins.lower = CONCAT44(builtins.lower._4_4_,3);
          iVar17 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                      (this_00,(char (*) [23])0x37a2dd,&clip_distance_size,(char (*) [3])0x381d96);
          }
          else {
            in_R9 = (char (*) [2])0x381d96;
            statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                      (this_00,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar17.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [25])") float gl_ClipDistance[",
                       &clip_distance_size,(char (*) [3])0x381d96);
          }
        }
        if ((emitted_builtins.lower & 0x10) != 0) {
          builtins.lower = CONCAT44(builtins.lower._4_4_,4);
          iVar17 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                      (this_00,(char (*) [23])0x37a2f6,&cull_distance_size,(char (*) [3])0x381d96);
          }
          else {
            in_R9 = (char (*) [2])0x381d96;
            statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                      (this_00,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar17.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [25])") float gl_CullDistance[",
                       &cull_distance_size,(char (*) [3])0x381d96);
          }
        }
        if ((local_230 & 1) == 0) {
          end_scope_decl(this_00);
        }
        else {
          if (local_264 == ExecutionModelTessellationControl && storage == StorageClassOutput) {
            (*(this_00->super_Compiler)._vptr_Compiler[6])
                      (&local_2c8,this_00,(ulong)(pSVar24->super_IVariant).self.id,1);
            pSVar18 = Compiler::get_entry_point(&this_00->super_Compiler);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&builtins,(spirv_cross *)&local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d448
                       ,(char (*) [2])&pSVar18->output_vertices,(uint *)0x3759d6,in_R9);
            end_scope_decl(this_00,(string *)&builtins);
          }
          else {
            ts_1_00 = (char (*) [3])0x1;
            (*(this_00->super_Compiler)._vptr_Compiler[6])
                      (&local_2c8,this_00,(ulong)(pSVar24->super_IVariant).self.id);
            join<std::__cxx11::string,char_const(&)[3]>
                      ((string *)&builtins,(spirv_cross *)&local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[]",
                       ts_1_00);
            end_scope_decl(this_00,(string *)&builtins);
          }
          ::std::__cxx11::string::~string((string *)&builtins);
          ::std::__cxx11::string::~string((string *)&local_2c8);
        }
        statement<char_const(&)[1]>(this_00,(char (*) [1])0x375a3a);
      }
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&builtin_xfb_offsets._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&global_builtins.higher._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&emitted_builtins.higher._M_h);
      return;
    }
    local_208 = (TypedID<(spirv_cross::Types)0> *)ts_1;
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [((TypedID<(spirv_cross::Types)0> *)ts_1)->id].type == TypeVariable) {
      local_2a0 = ParsedIR::get<spirv_cross::SPIRVariable>
                            (local_218,((TypedID<(spirv_cross::Types)0> *)ts_1)->id);
      pSVar13 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(local_2a0->super_IVariant).field_0xc
                          );
      bVar6 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,DecorationBlock
                        );
      builtins.lower = 0;
      builtins.higher._M_h._M_buckets = &builtins.higher._M_h._M_single_bucket;
      builtins.higher._M_h._M_bucket_count = 1;
      builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      builtins.higher._M_h._M_element_count = 0;
      builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
      builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
      SVar10 = local_2a0->storage;
      local_280 = pSVar13;
      if (bVar6 && SVar10 == storage) {
        bVar7 = Compiler::is_builtin_variable(&this->super_Compiler,local_2a0);
        if (!bVar7) {
          SVar10 = local_2a0->storage;
          goto LAB_0024e1db;
        }
        local_240 = pSVar24;
        pmVar14 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_238,&(local_280->super_IVariant).self);
        sVar2 = (pmVar14->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
        pDVar3 = (pmVar14->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        uVar25 = 0;
        pDVar23 = pDVar3;
        for (lVar26 = 0; storage = local_244, sVar2 * 0x168 - lVar26 != 0; lVar26 = lVar26 + 0x168)
        {
          if (((pDVar23->builtin == true) &&
              (bit = *(uint *)((long)(pDVar3->extended).values + lVar26 + -0x80), bit < 5)) &&
             (bit != 2)) {
            Bitset::set(&builtins,bit);
            BVar9 = *(BuiltIn *)((long)(pDVar3->extended).values + lVar26 + -0x80);
            puVar21 = (uint32_t *)(ulong)uVar25;
            if (BVar9 == BuiltInClipDistance) {
              pSVar13 = Compiler::get<spirv_cross::SPIRType>
                                  (&this->super_Compiler,
                                   (local_280->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[(long)puVar21].id);
              uVar8 = to_array_size_literal(this,pSVar13);
              ppuVar22 = &local_228;
LAB_0024e134:
              puVar21 = *ppuVar22;
              *puVar21 = uVar8;
              BVar9 = *(BuiltIn *)((long)(pDVar3->extended).values + lVar26 + -0x80);
            }
            else if (BVar9 == BuiltInCullDistance) {
              pSVar13 = Compiler::get<spirv_cross::SPIRType>
                                  (&this->super_Compiler,
                                   (local_280->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[(long)puVar21].id);
              uVar8 = to_array_size_literal(this,pSVar13);
              ppuVar22 = &local_220;
              goto LAB_0024e134;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               ((*(byte *)((long)&(pDVar3->decoration_flags).lower + lVar26 + 4) & 8) != 0)) {
              mVar1 = *(mapped_type *)((long)(pDVar3->extended).values + lVar26 + -0x6c);
              local_2c8._M_dataplus._M_p._0_4_ = BVar9;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&builtin_xfb_offsets,(key_type *)&local_2c8);
              *pmVar15 = mVar1;
              BVar9 = *(BuiltIn *)((long)(pDVar3->extended).values + lVar26 + -0x80);
              local_250 = CONCAT71((int7)((ulong)puVar21 >> 8),1);
              this = local_270;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               ((*(byte *)((long)&(pDVar3->decoration_flags).lower + lVar26 + 3) & 0x20) != 0)) {
              uVar8 = *(uint32_t *)((long)(pDVar3->extended).values + lVar26 + -0x60);
              if (((local_288 & 1) != 0) && (geom_stream != uVar8)) {
                pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_2c8,"IO block member Stream mismatch.",&local_2c9);
                CompilerError::CompilerError(pCVar19,&local_2c8);
                __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              local_288 = CONCAT71((uint7)(uint3)(uVar8 >> 8),1);
              geom_stream = uVar8;
            }
          }
          uVar25 = uVar25 + 1;
          pDVar23 = pDVar23 + 1;
        }
        pSVar24 = local_240;
        if (local_244 != StorageClassOutput) goto LAB_0024e46e;
        bVar6 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(local_2a0->super_IVariant).self.id,
                           DecorationXfbBuffer);
        pSVar24 = local_240;
        if ((bVar6) &&
           (bVar6 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(local_2a0->super_IVariant).self.id,
                               DecorationXfbStride), pSVar5 = local_2a0, bVar6)) {
          uVar8 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(local_2a0->super_IVariant).self.id,
                             DecorationXfbBuffer);
          uVar11 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(pSVar5->super_IVariant).self.id,
                              DecorationXfbStride);
          if ((local_278 & 1) != 0) {
            if (uVar8 != xfb_buffer) {
              pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,"IO block member XfbBuffer mismatch.",&local_2c9);
              CompilerError::CompilerError(pCVar19,&local_2c8);
              __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (uVar11 != xfb_stride) {
              pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c8,"IO block member XfbBuffer mismatch.",&local_2c9);
              CompilerError::CompilerError(pCVar19,&local_2c8);
              __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          local_278 = CONCAT71((int7)(CONCAT44(extraout_var,uVar11) >> 8),1);
          xfb_buffer = uVar8;
          xfb_stride = uVar11;
        }
        bVar6 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(local_2a0->super_IVariant).self.id,
                           DecorationStream);
        if (!bVar6) goto LAB_0024e46e;
        uVar8 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(local_2a0->super_IVariant).self.id,
                           DecorationStream);
        uVar16 = CONCAT44(extraout_var_00,uVar8);
        if (((local_288 & 1) != 0) && (geom_stream != uVar8)) {
          pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"IO block member Stream mismatch.",&local_2c9);
          CompilerError::CompilerError(pCVar19,&local_2c8);
          __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
LAB_0024e463:
        geom_stream = (uint32_t)uVar16;
        local_288 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
      }
      else {
LAB_0024e1db:
        if ((!bVar6 && SVar10 == storage) &&
           (bVar6 = Compiler::is_builtin_variable(&this->super_Compiler,local_2a0), bVar6)) {
          __k = &(local_2a0->super_IVariant).self;
          pmVar14 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_238,__k);
          if (((pmVar14->decoration).builtin == true) &&
             ((BVar9 = (pmVar14->decoration).builtin_type, BVar9 < BuiltInVertexId && (BVar9 != 2)))
             ) {
            Bitset::set(&global_builtins,BVar9);
            BVar9 = (pmVar14->decoration).builtin_type;
            if (BVar9 == BuiltInClipDistance) {
              uVar8 = to_array_size_literal(this,local_280);
              ppuVar22 = &local_228;
LAB_0024e392:
              **ppuVar22 = uVar8;
              BVar9 = (pmVar14->decoration).builtin_type;
            }
            else if (BVar9 == BuiltInCullDistance) {
              uVar8 = to_array_size_literal(this,local_280);
              ppuVar22 = &local_220;
              goto LAB_0024e392;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               ((~(pmVar14->decoration).decoration_flags.lower & 0x3800000000) == 0)) {
              uVar8 = (pmVar14->decoration).offset;
              local_2c8._M_dataplus._M_p._0_4_ = BVar9;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&builtin_xfb_offsets,(key_type *)&local_2c8);
              *pmVar15 = uVar8;
              uVar8 = (pmVar14->decoration).xfb_buffer;
              uVar11 = (pmVar14->decoration).xfb_stride;
              if ((local_278 & 1) != 0) {
                if (uVar8 != xfb_buffer) {
                  pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&local_2c8,"IO block member XfbBuffer mismatch.",&local_2c9);
                  CompilerError::CompilerError(pCVar19,&local_2c8);
                  __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                if (uVar11 != xfb_stride) {
                  pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&local_2c8,"IO block member XfbBuffer mismatch.",&local_2c9);
                  CompilerError::CompilerError(pCVar19,&local_2c8);
                  __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
              }
              BVar9 = (pmVar14->decoration).builtin_type;
              uVar4 = (uint3)(uVar11 >> 8);
              local_250 = CONCAT71((uint7)uVar4,1);
              local_278 = (ulong)CONCAT31(uVar4,1);
              this = local_270;
              xfb_buffer = uVar8;
              xfb_stride = uVar11;
            }
            if (((BVar9 < BuiltInVertexId) && (BVar9 != 2)) &&
               (((pmVar14->decoration).decoration_flags.lower & 0x20000000) != 0)) {
              uVar8 = Compiler::get_decoration(&this->super_Compiler,(ID)__k->id,DecorationStream);
              uVar16 = CONCAT44(extraout_var_01,uVar8);
              if (((local_288 & 1) != 0) && (geom_stream != uVar8)) {
                pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_2c8,"IO block member Stream mismatch.",&local_2c9);
                CompilerError::CompilerError(pCVar19,&local_2c8);
                __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              goto LAB_0024e463;
            }
          }
        }
      }
LAB_0024e46e:
      if (builtins.higher._M_h._M_element_count != 0 || builtins.lower != 0) {
        if ((local_258 & 1) != 0) {
          pCVar19 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Cannot use more than one builtin I/O block.",&local_2c9);
          CompilerError::CompilerError(pCVar19,&local_2c8);
          __cxa_throw(pCVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        Bitset::operator=(&emitted_builtins,&builtins);
        uVar20 = (undefined7)((ulong)local_280 >> 8);
        local_230 = CONCAT71(uVar20,(local_280->array).super_VectorView<unsigned_int>.buffer_size !=
                                    0);
        local_258 = CONCAT71(uVar20,1);
        pSVar24 = local_2a0;
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&builtins.higher._M_h);
    }
    ts_1 = (char *)(local_208 + 1);
  } while( true );
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;
	bool builtin_array = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	const auto builtin_is_per_vertex_set = [](BuiltIn builtin) -> bool {
		return builtin == BuiltInPosition || builtin == BuiltInPointSize ||
			builtin == BuiltInClipDistance || builtin == BuiltInCullDistance;
	};

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
			{
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		builtin_array = !type.array.empty();
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (model == ExecutionModelMeshEXT)
			statement("out gl_MeshPerVertexEXT");
		else if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	if (builtin_array)
	{
		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(to_name(block_var->self), "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(to_name(block_var->self), "[]"));
	}
	else
		end_scope_decl();
	statement("");
}